

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O2

void Rml::Detail::ShutdownObserverPtrPool(void)

{
  undefined1 *puVar1;
  
  puVar1 = observer_ptr_data;
  if (*(int *)(observer_ptr_data + 0x28) == 0) {
    Pool<Rml::Detail::ObserverPtrBlock>::~Pool
              ((Pool<Rml::Detail::ObserverPtrBlock> *)(observer_ptr_data + 8));
    operator_delete(puVar1,0x30);
    observer_ptr_data = (undefined1 *)0x0;
  }
  else {
    *observer_ptr_data = 1;
  }
  return;
}

Assistant:

void Detail::ShutdownObserverPtrPool()
{
	if (observer_ptr_data->block_pool.GetNumAllocatedObjects() == 0)
	{
		delete observer_ptr_data;
		observer_ptr_data = nullptr;
	}
	else
	{
		// This pool must outlive all other global variables that derive from EnableObserverPtr. This even includes user
		// variables which we have no control over. So if there are any objects still alive, let the pool garbage
		// collect itself when all references to it are gone. It is somewhat unreasonable to expect that no observer
		// pointers remain, particularly because that means no objects derived from Rml::EventListener can be alive in
		// user space, which can be a hassle to ensure and is otherwise pretty innocent.
		observer_ptr_data->is_shutdown = true;
	}
}